

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O0

void __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::SortedObservableDictionary
          (SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8991fb9c local_28 [3];
  SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_10 = this;
  IObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::IObservableDictionary
            ((IObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  *(undefined ***)this = &PTR__SortedObservableDictionary_0015c4d8;
  *(undefined ***)this = &PTR__SortedObservableDictionary_0015c4d8;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->_map);
  std::make_shared<std::recursive_mutex>();
  local_28[0].this = this;
  wigwag::
  signal<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
  ::
  signal<std::shared_ptr<std::recursive_mutex>&,SortedObservableDictionary<int,std::__cxx11::string>::SortedObservableDictionary()::_lambda(std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>const&)_1_,true,void>
            ((signal<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
              *)&this->_onChanged,&this->_mutex,local_28);
  local_30.this = this;
  wigwag::
  listenable<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
  ::
  listenable<std::shared_ptr<std::recursive_mutex>&,SortedObservableDictionary<int,std::__cxx11::string>::SortedObservableDictionary()::_lambda(std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>const&)_1_>
            ((listenable<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
              *)&this->_listenable,&this->_mutex,&local_30);
  return;
}

Assistant:

SortedObservableDictionary()
        : _mutex(std::make_shared<Mutex>()),
          _onChanged(_mutex, [&](const typename decltype(_onChanged)::handler_type& h) { for (auto p : _map) h(CollectionOp::ItemAdded, p.first, p.second); }),
          _listenable(_mutex, [&](const ListenerPtr& l) { for (auto p : _map) l->OnItemAdded(p.first, p.second); })
    { }